

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceMgr.cpp
# Opt level: O3

void __thiscall
llvm::SMDiagnostic::print
          (SMDiagnostic *this,char *ProgName,raw_ostream *OS,bool ShowColors,bool ShowKindLabel)

{
  byte bVar1;
  char *pcVar2;
  long lVar3;
  ulong uVar4;
  undefined1 *puVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  size_type sVar10;
  pointer pcVar11;
  bool bVar12;
  char *pcVar13;
  ulong uVar14;
  byte *pbVar15;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  _Alloc_hider _Var16;
  size_t sVar17;
  byte *extraout_RDX_01;
  byte *extraout_RDX_02;
  byte *extraout_RDX_03;
  byte *extraout_RDX_04;
  byte *extraout_RDX_05;
  byte *pbVar18;
  byte *extraout_RDX_06;
  long lVar19;
  undefined1 DisableColors;
  char *pcVar20;
  size_t OutCol;
  long lVar21;
  undefined8 uVar22;
  ulong uVar23;
  uint uVar24;
  size_t i;
  ulong uVar25;
  StringRef Str;
  StringRef Str_00;
  StringRef Str_01;
  StringRef Chars;
  size_type *local_98;
  string FixItInsertionLine;
  WithColor S_1;
  undefined1 local_60 [8];
  string CaretLine;
  
  bVar12 = !ShowColors;
  CaretLine._M_dataplus._M_p._0_1_ = bVar12;
  pcVar20 = (char *)0x0;
  DisableColors = ShowKindLabel;
  local_60 = (undefined1  [8])OS;
  CaretLine.field_2._8_8_ = this;
  WithColor::changeColor((WithColor *)local_60,SAVEDCOLOR,true,false);
  if ((ProgName != (char *)0x0) && (*ProgName != '\0')) {
    raw_ostream::operator<<((raw_ostream *)local_60,ProgName);
    Str.Length = 2;
    Str.Data = ": ";
    raw_ostream::operator<<((raw_ostream *)local_60,Str);
  }
  uVar22 = CaretLine.field_2._8_8_;
  if (*(long *)(CaretLine.field_2._8_8_ + 0x18) != 0) {
    iVar7 = std::__cxx11::string::compare((char *)(CaretLine.field_2._8_8_ + 0x10));
    if (iVar7 == 0) {
      Str_00.Length = 7;
      Str_00.Data = "<stdin>";
      raw_ostream::operator<<((raw_ostream *)local_60,Str_00);
      __buf = extraout_RDX_00;
    }
    else {
      raw_ostream::write((raw_ostream *)local_60,(int)*(undefined8 *)(uVar22 + 0x10),
                         *(void **)(uVar22 + 0x18),(size_t)pcVar20);
      __buf = extraout_RDX;
    }
    if (*(int *)(CaretLine.field_2._8_8_ + 0x30) != -1) {
      pcVar2 = *(char **)((long)local_60 + 0x18);
      if (pcVar2 < *(char **)((long)local_60 + 0x10)) {
        pcVar20 = pcVar2 + 1;
        *(char **)((long)local_60 + 0x18) = pcVar20;
        *pcVar2 = ':';
      }
      else {
        raw_ostream::write((raw_ostream *)local_60,0x3a,__buf,(size_t)pcVar20);
      }
      uVar22 = CaretLine.field_2._8_8_;
      raw_ostream::operator<<
                ((raw_ostream *)local_60,(long)*(int *)(CaretLine.field_2._8_8_ + 0x30));
      if (*(int *)(uVar22 + 0x34) != -1) {
        pcVar2 = *(char **)((long)local_60 + 0x18);
        if (pcVar2 < *(char **)((long)local_60 + 0x10)) {
          *(char **)((long)local_60 + 0x18) = pcVar2 + 1;
          *pcVar2 = ':';
        }
        else {
          raw_ostream::write((raw_ostream *)local_60,0x3a,__buf_00,(size_t)pcVar20);
        }
        raw_ostream::operator<<
                  ((raw_ostream *)local_60,(long)*(int *)(CaretLine.field_2._8_8_ + 0x34) + 1);
      }
    }
    Str_01.Length = 2;
    Str_01.Data = ": ";
    raw_ostream::operator<<((raw_ostream *)local_60,Str_01);
  }
  WithColor::~WithColor((WithColor *)local_60);
  uVar22 = CaretLine.field_2._8_8_;
  if (ShowKindLabel) {
    switch(*(undefined4 *)(CaretLine.field_2._8_8_ + 0x38)) {
    case 0:
      WithColor::error((WithColor *)OS,(raw_ostream *)0xe67796,(StringRef)(ZEXT116(bVar12) << 0x40),
                       (bool)DisableColors);
      break;
    case 1:
      WithColor::warning((WithColor *)OS,(raw_ostream *)0xe67796,
                         (StringRef)(ZEXT116(bVar12) << 0x40),(bool)DisableColors);
      break;
    case 2:
      WithColor::remark((WithColor *)OS,(raw_ostream *)0xe67796,(StringRef)(ZEXT116(bVar12) << 0x40)
                        ,(bool)DisableColors);
      break;
    case 3:
      WithColor::note((WithColor *)OS,(raw_ostream *)0xe67796,(StringRef)(ZEXT116(bVar12) << 0x40),
                      (bool)DisableColors);
    }
  }
  sVar17 = 0;
  local_60 = (undefined1  [8])OS;
  WithColor::changeColor((WithColor *)local_60,SAVEDCOLOR,true,false);
  raw_ostream::write((raw_ostream *)local_60,(int)*(undefined8 *)(uVar22 + 0x40),
                     *(void **)(uVar22 + 0x48),sVar17);
  pcVar20 = *(char **)((long)local_60 + 0x18);
  if (pcVar20 < *(char **)((long)local_60 + 0x10)) {
    *(char **)((long)local_60 + 0x18) = pcVar20 + 1;
    *pcVar20 = '\n';
  }
  else {
    raw_ostream::write((raw_ostream *)local_60,10,__buf_01,sVar17);
  }
  WithColor::~WithColor((WithColor *)local_60);
  if (*(int *)(uVar22 + 0x30) == -1) {
    return;
  }
  if (*(int *)(uVar22 + 0x34) == -1) {
    return;
  }
  pcVar20 = ((StringRef *)(uVar22 + 0x60))->Data;
  uVar23 = *(ulong *)(uVar22 + 0x68);
  pcVar2 = pcVar20 + uVar23;
  pcVar13 = pcVar20;
  if (0 < (long)uVar23 >> 2) {
    pcVar13 = pcVar20 + (uVar23 & 0xfffffffffffffffc);
    lVar19 = ((long)uVar23 >> 2) + 1;
    pcVar20 = pcVar20 + 3;
    do {
      if (pcVar20[-3] < '\0') {
        pcVar20 = pcVar20 + -3;
        goto LAB_00d9e4ac;
      }
      if (pcVar20[-2] < '\0') {
        pcVar20 = pcVar20 + -2;
        goto LAB_00d9e4ac;
      }
      if (pcVar20[-1] < '\0') {
        pcVar20 = pcVar20 + -1;
        goto LAB_00d9e4ac;
      }
      if (*pcVar20 < '\0') goto LAB_00d9e4ac;
      lVar19 = lVar19 + -1;
      pcVar20 = pcVar20 + 4;
    } while (1 < lVar19);
  }
  lVar19 = (long)pcVar2 - (long)pcVar13;
  if (lVar19 == 1) {
LAB_00d9e491:
    pcVar20 = pcVar13;
    if (-1 < *pcVar13) {
      pcVar20 = pcVar2;
    }
  }
  else if (lVar19 == 2) {
LAB_00d9e489:
    pcVar20 = pcVar13;
    if (-1 < *pcVar13) {
      pcVar13 = pcVar13 + 1;
      goto LAB_00d9e491;
    }
  }
  else {
    if (lVar19 != 3) goto LAB_00d9e4be;
    pcVar20 = pcVar13;
    if (-1 < *pcVar13) {
      pcVar13 = pcVar13 + 1;
      goto LAB_00d9e489;
    }
  }
LAB_00d9e4ac:
  if (pcVar20 != pcVar2) {
    printSourceLine(OS,*(StringRef *)(uVar22 + 0x60));
    return;
  }
LAB_00d9e4be:
  local_60 = (undefined1  [8])&CaretLine._M_string_length;
  std::__cxx11::string::_M_construct((ulong)local_60,(char)uVar23 + '\x01');
  uVar9 = (ulong)(*(long *)(uVar22 + 0x88) - *(long *)(uVar22 + 0x80)) >> 3;
  if ((int)uVar9 != 0) {
    uVar25 = 0;
    do {
      uVar14 = (ulong)*(uint *)(*(long *)(uVar22 + 0x80) + uVar25 * 8);
      _Var16._M_p = (pointer)(ulong)*(uint *)(*(long *)(uVar22 + 0x80) + 4 + uVar25 * 8);
      if (CaretLine._M_dataplus._M_p < _Var16._M_p) {
        _Var16._M_p = CaretLine._M_dataplus._M_p;
      }
      sVar17 = (long)_Var16._M_p - uVar14;
      if (sVar17 != 0) {
        memset((void *)((long)(_func_int ***)local_60 + uVar14),0x7e,sVar17);
      }
      uVar25 = uVar25 + 1;
    } while ((uVar9 & 0xffffffff) != uVar25);
  }
  local_98 = &FixItInsertionLine._M_string_length;
  FixItInsertionLine._M_dataplus._M_p = (pointer)0x0;
  FixItInsertionLine._M_string_length._0_1_ = 0;
  uVar24 = *(uint *)(uVar22 + 0xa0);
  uVar8 = *(uint *)(uVar22 + 0x34);
  if ((ulong)uVar24 != 0) {
    lVar19 = *(long *)(uVar22 + 0x68);
    uVar25 = *(long *)(uVar22 + 8) - (long)(int)uVar8;
    lVar3 = *(long *)(uVar22 + 0x98);
    uVar9 = uVar25 + lVar19;
    lVar21 = 0;
    S_1.DisableColors = false;
    S_1._9_7_ = 0;
    do {
      FixItInsertionLine.field_2._8_8_ = *(undefined8 *)(lVar3 + 0x10 + lVar21);
      Chars.Length = 3;
      Chars.Data = "\n\r\t";
      sVar10 = StringRef::find_first_of
                         ((StringRef *)((long)&FixItInsertionLine.field_2 + 8),Chars,0);
      if (sVar10 == 0xffffffffffffffff) {
        uVar14 = *(ulong *)(lVar3 + lVar21);
        uVar4 = *(ulong *)(lVar3 + 8 + lVar21);
        if (uVar25 <= uVar4 && uVar14 <= uVar9) {
          uVar8 = (int)uVar14 - (int)uVar25;
          if (uVar14 < uVar25) {
            uVar8 = 0;
          }
          uVar14 = (ulong)uVar8;
          uVar6 = S_1._8_4_ + 1;
          if ((ulong)S_1._8_8_ <= uVar14) {
            uVar6 = uVar8;
          }
          sVar17 = *(size_t *)(lVar3 + 0x18 + lVar21);
          uVar8 = (int)sVar17 + uVar6;
          S_1._8_8_ = ZEXT48(uVar8);
          if (FixItInsertionLine._M_dataplus._M_p < (ulong)S_1._8_8_) {
            std::__cxx11::string::resize((ulong)&local_98,(char)uVar8);
            sVar17 = *(size_t *)(lVar3 + 0x18 + lVar21);
          }
          if (sVar17 != 0) {
            memmove((void *)((ulong)uVar6 + (long)local_98),*(void **)(lVar3 + 0x10 + lVar21),sVar17
                   );
          }
          uVar8 = (int)uVar4 - (int)uVar25;
          if (uVar9 <= uVar4) {
            uVar8 = (uint)lVar19;
          }
          if (uVar8 - uVar14 != 0) {
            memset((void *)((long)(_func_int ***)local_60 + uVar14),0x7e,uVar8 - uVar14);
          }
        }
      }
      lVar21 = lVar21 + 0x30;
    } while ((ulong)uVar24 * 0x30 != lVar21);
    uVar8 = *(uint *)(CaretLine.field_2._8_8_ + 0x34);
    uVar22 = CaretLine.field_2._8_8_;
  }
  uVar9 = (long)(int)uVar8;
  if (uVar23 < uVar8) {
    uVar9 = uVar23;
  }
  *(undefined1 *)((long)(_func_int ***)local_60 + uVar9) = 0x5e;
  lVar19 = std::__cxx11::string::find_last_not_of((char)local_60,0x20);
  pcVar11 = (pointer)(lVar19 + 1);
  if (pcVar11 <= CaretLine._M_dataplus._M_p) {
    pcVar11[(long)(_func_int ***)local_60] = '\0';
    CaretLine._M_dataplus._M_p = pcVar11;
    printSourceLine(OS,*(StringRef *)(uVar22 + 0x60));
    pbVar15 = (byte *)0x0;
    FixItInsertionLine.field_2._8_8_ = OS;
    WithColor::changeColor((WithColor *)((long)&FixItInsertionLine.field_2 + 8),GREEN,true,false);
    uVar23 = (ulong)CaretLine._M_dataplus._M_p & 0xffffffff;
    pbVar18 = extraout_RDX_01;
    if (uVar23 != 0) {
      uVar9 = 0;
      uVar24 = 0;
      do {
        if ((uVar9 < *(ulong *)(CaretLine.field_2._8_8_ + 0x68)) &&
           (*(char *)(*(long *)(CaretLine.field_2._8_8_ + 0x60) + uVar9) == '\t')) {
          do {
            bVar1 = *(byte *)((long)(_func_int ***)local_60 + uVar9);
            pbVar15 = *(byte **)(FixItInsertionLine.field_2._8_8_ + 0x18);
            if (pbVar15 < *(byte **)(FixItInsertionLine.field_2._8_8_ + 0x10)) {
              pbVar18 = pbVar15 + 1;
              *(byte **)(FixItInsertionLine.field_2._8_8_ + 0x18) = pbVar18;
              *pbVar15 = bVar1;
            }
            else {
              raw_ostream::write((raw_ostream *)FixItInsertionLine.field_2._8_8_,(uint)bVar1,pbVar18
                                 ,(size_t)pbVar15);
              pbVar18 = extraout_RDX_02;
            }
            uVar24 = uVar24 + 1;
          } while ((uVar24 & 7) != 0);
        }
        else {
          bVar1 = *(byte *)((long)(_func_int ***)local_60 + uVar9);
          pbVar15 = *(byte **)(FixItInsertionLine.field_2._8_8_ + 0x18);
          if (pbVar15 < *(byte **)(FixItInsertionLine.field_2._8_8_ + 0x10)) {
            pbVar18 = pbVar15 + 1;
            *(byte **)(FixItInsertionLine.field_2._8_8_ + 0x18) = pbVar18;
            *pbVar15 = bVar1;
          }
          else {
            raw_ostream::write((raw_ostream *)FixItInsertionLine.field_2._8_8_,(uint)bVar1,pbVar18,
                               (size_t)pbVar15);
            pbVar18 = extraout_RDX_03;
          }
          uVar24 = uVar24 + 1;
        }
        uVar9 = uVar9 + 1;
      } while (uVar9 != uVar23);
    }
    puVar5 = *(undefined1 **)(FixItInsertionLine.field_2._8_8_ + 0x18);
    if (puVar5 < *(undefined1 **)(FixItInsertionLine.field_2._8_8_ + 0x10)) {
      *(undefined1 **)(FixItInsertionLine.field_2._8_8_ + 0x18) = puVar5 + 1;
      *puVar5 = 10;
    }
    else {
      raw_ostream::write((raw_ostream *)FixItInsertionLine.field_2._8_8_,10,pbVar18,(size_t)pbVar15)
      ;
    }
    WithColor::~WithColor((WithColor *)((long)&FixItInsertionLine.field_2 + 8));
    _Var16 = FixItInsertionLine._M_dataplus;
    if (FixItInsertionLine._M_dataplus._M_p != (pointer)0x0) {
      uVar23 = 0;
      pcVar11 = (pointer)0x0;
      pbVar18 = extraout_RDX_04;
      do {
        if ((pcVar11 < *(pointer *)(CaretLine.field_2._8_8_ + 0x68)) &&
           (pcVar11[*(long *)(CaretLine.field_2._8_8_ + 0x60)] == '\t')) {
          do {
            bVar1 = *(byte *)((long)local_98 + (long)pcVar11);
            pbVar15 = (byte *)OS->OutBufCur;
            if (pbVar15 < OS->OutBufEnd) {
              pbVar18 = pbVar15 + 1;
              OS->OutBufCur = (char *)pbVar18;
              *pbVar15 = bVar1;
            }
            else {
              raw_ostream::write(OS,(uint)bVar1,pbVar18,(size_t)pbVar15);
              pbVar18 = extraout_RDX_05;
            }
            pbVar15 = (byte *)(ulong)(*(char *)((long)local_98 + (long)pcVar11) != ' ');
            pcVar11 = pcVar11 + (long)pbVar15;
            uVar23 = uVar23 + 1;
          } while (((uVar23 & 7) != 0) && (pcVar11 != _Var16._M_p));
        }
        else {
          bVar1 = *(byte *)((long)local_98 + (long)pcVar11);
          pbVar15 = (byte *)OS->OutBufCur;
          if (pbVar15 < OS->OutBufEnd) {
            pbVar18 = pbVar15 + 1;
            OS->OutBufCur = (char *)pbVar18;
            *pbVar15 = bVar1;
          }
          else {
            raw_ostream::write(OS,(uint)bVar1,pbVar18,(size_t)pbVar15);
            pbVar18 = extraout_RDX_06;
          }
          uVar23 = uVar23 + 1;
        }
        pcVar11 = pcVar11 + 1;
      } while (pcVar11 < _Var16._M_p);
      pcVar20 = OS->OutBufCur;
      if (pcVar20 < OS->OutBufEnd) {
        OS->OutBufCur = pcVar20 + 1;
        *pcVar20 = '\n';
      }
      else {
        raw_ostream::write(OS,10,pbVar18,(size_t)pbVar15);
      }
    }
    if (local_98 != &FixItInsertionLine._M_string_length) {
      operator_delete(local_98,CONCAT71(FixItInsertionLine._M_string_length._1_7_,
                                        (undefined1)FixItInsertionLine._M_string_length) + 1);
    }
    if (local_60 != (undefined1  [8])&CaretLine._M_string_length) {
      operator_delete((void *)local_60,CaretLine._M_string_length + 1);
    }
    return;
  }
  std::__throw_out_of_range_fmt
            ("%s: __pos (which is %zu) > this->size() (which is %zu)","basic_string::erase",pcVar11)
  ;
}

Assistant:

void SMDiagnostic::print(const char *ProgName, raw_ostream &OS,
                         bool ShowColors, bool ShowKindLabel) const {
  {
    WithColor S(OS, raw_ostream::SAVEDCOLOR, true, false, !ShowColors);

    if (ProgName && ProgName[0])
      S << ProgName << ": ";

    if (!Filename.empty()) {
      if (Filename == "-")
        S << "<stdin>";
      else
        S << Filename;

      if (LineNo != -1) {
        S << ':' << LineNo;
        if (ColumnNo != -1)
          S << ':' << (ColumnNo + 1);
      }
      S << ": ";
    }
  }

  if (ShowKindLabel) {
    switch (Kind) {
    case SourceMgr::DK_Error:
      WithColor::error(OS, "", !ShowColors);
      break;
    case SourceMgr::DK_Warning:
      WithColor::warning(OS, "", !ShowColors);
      break;
    case SourceMgr::DK_Note:
      WithColor::note(OS, "", !ShowColors);
      break;
    case SourceMgr::DK_Remark:
      WithColor::remark(OS, "", !ShowColors);
      break;
    }
  }

  WithColor(OS, raw_ostream::SAVEDCOLOR, true, false, !ShowColors)
      << Message << '\n';

  if (LineNo == -1 || ColumnNo == -1)
    return;

  // FIXME: If there are multibyte or multi-column characters in the source, all
  // our ranges will be wrong. To do this properly, we'll need a byte-to-column
  // map like Clang's TextDiagnostic. For now, we'll just handle tabs by
  // expanding them later, and bail out rather than show incorrect ranges and
  // misaligned fixits for any other odd characters.
  if (find_if(LineContents, isNonASCII) != LineContents.end()) {
    printSourceLine(OS, LineContents);
    return;
  }
  size_t NumColumns = LineContents.size();

  // Build the line with the caret and ranges.
  std::string CaretLine(NumColumns+1, ' ');

  // Expand any ranges.
  for (unsigned r = 0, e = Ranges.size(); r != e; ++r) {
    std::pair<unsigned, unsigned> R = Ranges[r];
    std::fill(&CaretLine[R.first],
              &CaretLine[std::min((size_t)R.second, CaretLine.size())],
              '~');
  }

  // Add any fix-its.
  // FIXME: Find the beginning of the line properly for multibyte characters.
  std::string FixItInsertionLine;
  buildFixItLine(CaretLine, FixItInsertionLine, FixIts,
                 makeArrayRef(Loc.getPointer() - ColumnNo,
                              LineContents.size()));

  // Finally, plop on the caret.
  if (unsigned(ColumnNo) <= NumColumns)
    CaretLine[ColumnNo] = '^';
  else
    CaretLine[NumColumns] = '^';

  // ... and remove trailing whitespace so the output doesn't wrap for it.  We
  // know that the line isn't completely empty because it has the caret in it at
  // least.
  CaretLine.erase(CaretLine.find_last_not_of(' ')+1);

  printSourceLine(OS, LineContents);

  {
    WithColor S(OS, raw_ostream::GREEN, true, false, !ShowColors);

    // Print out the caret line, matching tabs in the source line.
    for (unsigned i = 0, e = CaretLine.size(), OutCol = 0; i != e; ++i) {
      if (i >= LineContents.size() || LineContents[i] != '\t') {
        S << CaretLine[i];
        ++OutCol;
        continue;
      }

      // Okay, we have a tab.  Insert the appropriate number of characters.
      do {
        S << CaretLine[i];
        ++OutCol;
      } while ((OutCol % TabStop) != 0);
    }
    S << '\n';
  }

  // Print out the replacement line, matching tabs in the source line.
  if (FixItInsertionLine.empty())
    return;

  for (size_t i = 0, e = FixItInsertionLine.size(), OutCol = 0; i < e; ++i) {
    if (i >= LineContents.size() || LineContents[i] != '\t') {
      OS << FixItInsertionLine[i];
      ++OutCol;
      continue;
    }

    // Okay, we have a tab.  Insert the appropriate number of characters.
    do {
      OS << FixItInsertionLine[i];
      // FIXME: This is trying not to break up replacements, but then to re-sync
      // with the tabs between replacements. This will fail, though, if two
      // fix-it replacements are exactly adjacent, or if a fix-it contains a
      // space. Really we should be precomputing column widths, which we'll
      // need anyway for multibyte chars.
      if (FixItInsertionLine[i] != ' ')
        ++i;
      ++OutCol;
    } while (((OutCol % TabStop) != 0) && i != e);
  }
  OS << '\n';
}